

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O2

void __thiscall xLearn::MODEL_TEST_Save_and_Load_Test::TestBody(MODEL_TEST_Save_and_Load_Test *this)

{
  int i;
  ulong uVar1;
  char *pcVar2;
  int i_2;
  undefined1 auVar3 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  AssertHelper local_398;
  AssertionResult gtest_ar;
  index_t v_len;
  index_t param_num_v;
  index_t w_len;
  index_t param_num_w;
  real_t *local_370;
  real_t *local_368;
  Model new_model;
  Model model_ffm;
  HyperParam hyper_param;
  
  Init();
  model_ffm.score_func_._M_dataplus._M_p = (pointer)&model_ffm.score_func_.field_2;
  model_ffm.score_func_._M_string_length = 0;
  model_ffm.score_func_.field_2._M_local_buf[0] = '\0';
  model_ffm.loss_func_._M_dataplus._M_p = (pointer)&model_ffm.loss_func_.field_2;
  model_ffm.loss_func_._M_string_length = 0;
  model_ffm.loss_func_.field_2._M_local_buf[0] = '\0';
  model_ffm.param_w_ = (real_t *)0x0;
  model_ffm.param_v_ = (real_t *)0x0;
  model_ffm.param_b_ = (real_t *)0x0;
  model_ffm.param_best_w_ = (real_t *)0x0;
  model_ffm.param_best_v_ = (real_t *)0x0;
  model_ffm.param_best_b_ = (real_t *)0x0;
  auVar3 = SUB6416(ZEXT464(0x3f800000),0);
  Model::Initialize(&model_ffm,&hyper_param.score_func,&hyper_param.loss_func,
                    hyper_param.num_feature,hyper_param.num_field,hyper_param.num_K,
                    hyper_param.auxiliary_size,1.0);
  w_len = model_ffm.param_num_w_;
  for (uVar1 = 0; model_ffm.param_num_w_ != uVar1; uVar1 = uVar1 + 1) {
    model_ffm.param_w_[uVar1] = 2.5;
  }
  v_len = model_ffm.param_num_v_;
  for (uVar1 = 0; model_ffm.param_num_v_ != uVar1; uVar1 = uVar1 + 1) {
    model_ffm.param_v_[uVar1] = 3.5;
  }
  Model::Serialize(&model_ffm,&hyper_param.model_file);
  Model::Model(&new_model,&hyper_param.model_file);
  w_len = new_model.param_num_w_;
  param_num_w = hyper_param.num_feature * 2;
  local_368 = new_model.param_w_;
  local_370 = new_model.param_v_;
  v_len = new_model.param_num_v_;
  param_num_v = param_num_w * hyper_param.num_field * hyper_param.num_K;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"w_len","param_num_w",&w_len,&param_num_w);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"v_len","param_num_v",&v_len,&param_num_v);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_3a0.ptr_._0_4_ = param_num_v + 2 + param_num_w;
  local_398.data_._0_4_ = new_model.param_num_w_ + 2 + new_model.param_num_v_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"param_num_v+param_num_w+2","new_model.GetNumParameter()",
             (uint *)&local_3a0,(uint *)&local_398);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"hyper_param.score_func","new_model.GetScoreFunction()",
             &hyper_param.score_func,&new_model.score_func_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"hyper_param.loss_func","new_model.GetLossFunction()",
             &hyper_param.loss_func,&new_model.loss_func_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_3a0.ptr_._0_4_ = new_model.num_K_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"hyper_param.num_K","new_model.GetNumK()",&hyper_param.num_K,
             (uint *)&local_3a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_3a0.ptr_._0_4_ = new_model.num_feat_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"hyper_param.num_feature","new_model.GetNumFeature()",
             &hyper_param.num_feature,(uint *)&local_3a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xba,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_3a0.ptr_._0_4_ = new_model.num_field_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"hyper_param.num_field","new_model.GetNumField()",
             &hyper_param.num_field,(uint *)&local_3a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xbb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  auVar3 = vcvtusi2ss_avx512f(auVar3,new_model.aux_size_);
  local_3a0.ptr_._0_4_ = auVar3._0_4_;
  testing::internal::CmpHelperEQ<unsigned_int,float>
            ((internal *)&gtest_ar,"hyper_param.auxiliary_size","new_model.GetAuxiliarySize()",
             &hyper_param.auxiliary_size,(float *)&local_3a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xbc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"b[0]","0",*new_model.param_b_,0.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xbd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"b[1]","1.0",new_model.param_b_[1],1.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xbe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  for (uVar1 = 0; uVar1 < w_len; uVar1 = uVar1 + 1) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&gtest_ar,"w[i]","2.5",local_368[uVar1],2.5);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_3a0);
      pcVar2 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                 ,0xc0,pcVar2);
      testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
      testing::internal::AssertHelper::~AssertHelper(&local_398);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_3a0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  for (uVar1 = 0; uVar1 < v_len; uVar1 = uVar1 + 1) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&gtest_ar,"v[i]","3.5",local_370[uVar1],3.5);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_3a0);
      pcVar2 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                 ,0xc3,pcVar2);
      testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
      testing::internal::AssertHelper::~AssertHelper(&local_398);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_3a0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  RemoveFile(hyper_param.model_file._M_dataplus._M_p);
  Model::~Model(&new_model);
  Model::~Model(&model_ffm);
  HyperParam::~HyperParam(&hyper_param);
  return;
}

Assistant:

TEST(MODEL_TEST, Save_and_Load) {
  // Init model
  HyperParam hyper_param = Init();
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K, 
                    hyper_param.auxiliary_size);
  real_t* w = model_ffm.GetParameter_w();
  index_t w_len = model_ffm.GetNumParameter_w();
  for (int i = 0; i < w_len; ++i) {
    w[i] = 2.5;
  }
  real_t* v = model_ffm.GetParameter_v();
  index_t v_len = model_ffm.GetNumParameter_v();
  for (int i = 0; i < v_len; ++i) {
    v[i] = 3.5;
  }
  model_ffm.Serialize(hyper_param.model_file);
  Model new_model(hyper_param.model_file);
  real_t* b = new_model.GetParameter_b();
  w = new_model.GetParameter_w();
  w_len = new_model.GetNumParameter_w();
  v = new_model.GetParameter_v();
  v_len = new_model.GetNumParameter_v();
  index_t param_num_w = hyper_param.num_feature * 2;
  index_t param_num_v = hyper_param.num_feature *
                      hyper_param.num_field *
                      hyper_param.num_K * 2;
  EXPECT_EQ(w_len, param_num_w);
  EXPECT_EQ(v_len, param_num_v);
  EXPECT_EQ(param_num_v+param_num_w+2, new_model.GetNumParameter());
  EXPECT_EQ(hyper_param.score_func, new_model.GetScoreFunction());
  EXPECT_EQ(hyper_param.loss_func, new_model.GetLossFunction());
  EXPECT_EQ(hyper_param.num_K, new_model.GetNumK());
  EXPECT_EQ(hyper_param.num_feature, new_model.GetNumFeature());
  EXPECT_EQ(hyper_param.num_field, new_model.GetNumField());
  EXPECT_EQ(hyper_param.auxiliary_size, new_model.GetAuxiliarySize());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  for (int i = 0; i < w_len; ++i) {
    EXPECT_FLOAT_EQ(w[i], 2.5);
  }
  for (int i = 0; i < v_len; ++i) {
    EXPECT_FLOAT_EQ(v[i], 3.5);
  }
  RemoveFile(hyper_param.model_file.c_str());
}